

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flasher.cpp
# Opt level: O3

ssize_t __thiscall Flasher::write(Flasher *this,int __fd,void *__buf,size_t __n)

{
  Flash *pFVar1;
  FlasherObserver *pFVar2;
  _func_int *p_Var3;
  undefined1 *puVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  FILE *pFVar8;
  long lVar9;
  ulong uVar10;
  size_t sVar11;
  undefined4 extraout_var;
  int *piVar12;
  undefined8 *puVar13;
  undefined4 in_register_00000034;
  pointer_____offset_0x10___ *ppuVar14;
  ulong __n_00;
  undefined1 auStack_1068 [4088];
  undefined1 *puStack_70;
  undefined1 auStack_68 [8];
  ulong local_60;
  undefined1 *local_58;
  ulong local_50;
  ulong local_48;
  FILE *local_40;
  uint local_34;
  
  uVar10 = (ulong)__buf & 0xffffffff;
  puStack_70 = (undefined1 *)0x10a795;
  local_34 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
                super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[3])();
  local_48 = uVar10 / local_34;
  if ((int)(uVar10 % (ulong)local_34) != 0) {
LAB_0010a9fa:
    puStack_70 = (undefined1 *)0x10aa04;
    puVar13 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar13 = &PTR__exception_00118388;
    puStack_70 = (undefined1 *)0x10aa24;
    __cxa_throw(puVar13,&FlashOffsetError::typeinfo,std::exception::~exception);
  }
  puStack_70 = (undefined1 *)0x10a7ba;
  uVar6 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[6])();
  if (uVar6 <= (uint)__buf) goto LAB_0010a9fa;
  puStack_70 = (undefined1 *)0x10a7d2;
  pFVar8 = fopen((char *)CONCAT44(in_register_00000034,__fd),"rb");
  if (pFVar8 == (FILE *)0x0) {
    puStack_70 = (undefined1 *)0x10aa58;
    puVar13 = (undefined8 *)__cxa_allocate_exception(0x10);
    puStack_70 = (undefined1 *)0x10aa60;
    piVar12 = __errno_location();
    iVar7 = *piVar12;
    *puVar13 = &PTR__exception_001183b0;
    *(int *)(puVar13 + 1) = iVar7;
    puStack_70 = (undefined1 *)0x10aa85;
    __cxa_throw(puVar13,&FileOpenError::typeinfo,std::exception::~exception);
  }
  puStack_70 = (undefined1 *)0x10a7f1;
  local_60 = uVar10;
  iVar7 = fseek(pFVar8,0,2);
  local_40 = pFVar8;
  if (iVar7 == 0) {
    puStack_70 = (undefined1 *)0x10a805;
    lVar9 = ftell(pFVar8);
    if (-1 < lVar9) {
      puStack_70 = (undefined1 *)0x10a819;
      rewind(pFVar8);
      __n_00 = (ulong)local_34;
      uVar10 = (long)(__n_00 + lVar9 + -1) / (long)__n_00;
      puStack_70 = (undefined1 *)0x10a839;
      uVar6 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t
                 .super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                 super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[4])();
      if ((uint)uVar10 <= uVar6) {
        puStack_70 = (undefined1 *)0x10a85c;
        (*this->_observer->_vptr_FlasherObserver[2])
                  (this->_observer,"Write %ld bytes to flash (%u pages)\n",lVar9,uVar10 & 0xffffffff
                  );
        local_50 = uVar10;
        if (this->_samba->_canWriteBuffer == true) {
          local_58 = auStack_68;
          sVar11 = fread(auStack_1068,1,0x1000,pFVar8);
          if (sVar11 != 0) {
            local_48 = __n_00 - 1;
            uVar10 = 0;
            do {
              (*this->_observer->_vptr_FlasherObserver[3])
                        (this->_observer,uVar10 / local_34,local_50);
              if (sVar11 < 0x1000) {
                memset(auStack_1068 + sVar11,0,0x1000 - sVar11);
                sVar11 = (sVar11 + local_48) - (sVar11 + local_48) % __n_00;
              }
              pFVar1 = (this->_flash->_M_t).
                       super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
                       super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                       super__Head_base<0UL,_Flash_*,_false>._M_head_impl;
              (*pFVar1->_vptr_Flash[0x1b])(pFVar1,auStack_1068,sVar11 & 0xffff);
              pFVar1 = (this->_flash->_M_t).
                       super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
                       super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                       super__Head_base<0UL,_Flash_*,_false>._M_head_impl;
              (*pFVar1->_vptr_Flash[0x1a])
                        (pFVar1,(ulong)(uint)((int)uVar10 + (int)local_60),sVar11 & 0xffffffff);
              uVar10 = (ulong)(uint)((int)uVar10 + (int)sVar11);
              sVar11 = fread(auStack_1068,1,0x1000,local_40);
            } while (sVar11 != 0);
          }
        }
        else {
          lVar9 = -(__n_00 + 0xf & 0xfffffffffffffff0);
          local_34 = (uint)uVar10 - 1;
          uVar10 = 0;
          local_58 = auStack_68;
          while( true ) {
            pFVar8 = local_40;
            *(undefined8 *)(auStack_68 + lVar9 + -8) = 0x10a978;
            sVar11 = fread(auStack_68 + lVar9,1,__n_00,pFVar8);
            uVar5 = local_50;
            if (sVar11 == 0) break;
            pFVar2 = this->_observer;
            uVar6 = (uint)uVar10;
            p_Var3 = pFVar2->_vptr_FlasherObserver[3];
            *(undefined8 *)(auStack_68 + lVar9 + -8) = 0x10a991;
            (*p_Var3)(pFVar2,uVar10,uVar5);
            pFVar1 = (this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>.
                     _M_t.super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                     super__Head_base<0UL,_Flash_*,_false>._M_head_impl;
            p_Var3 = pFVar1->_vptr_Flash[0x1b];
            *(undefined8 *)(auStack_68 + lVar9 + -8) = 0x10a9a8;
            (*p_Var3)(pFVar1,auStack_68 + lVar9,sVar11 & 0xffff);
            pFVar1 = (this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>.
                     _M_t.super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                     super__Head_base<0UL,_Flash_*,_false>._M_head_impl;
            iVar7 = (int)local_48;
            p_Var3 = pFVar1->_vptr_Flash[0x18];
            *(undefined8 *)(auStack_68 + lVar9 + -8) = 0x10a9c0;
            (*p_Var3)(pFVar1,(ulong)(uVar6 + iVar7));
            if ((local_34 == uVar6) || (uVar10 = (ulong)(uVar6 + 1), sVar11 != __n_00)) break;
          }
        }
        pFVar8 = local_40;
        puVar4 = local_58;
        *(undefined8 *)(local_58 + -8) = 0x10a9db;
        fclose(pFVar8);
        pFVar2 = this->_observer;
        uVar10 = local_50 & 0xffffffff;
        p_Var3 = pFVar2->_vptr_FlasherObserver[3];
        *(undefined8 *)(puVar4 + -8) = 0x10a9eb;
        iVar7 = (*p_Var3)(pFVar2,uVar10);
        return CONCAT44(extraout_var,iVar7);
      }
      puStack_70 = (undefined1 *)0x10aa8f;
      puVar13 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar13 = &PTR__exception_00118400;
      ppuVar14 = &FileSizeError::typeinfo;
      goto LAB_0010aaa3;
    }
  }
  puStack_70 = (undefined1 *)0x10aa2e;
  puVar13 = (undefined8 *)__cxa_allocate_exception(0x10);
  puStack_70 = (undefined1 *)0x10aa36;
  piVar12 = __errno_location();
  iVar7 = *piVar12;
  *puVar13 = &PTR__exception_001183d8;
  *(int *)(puVar13 + 1) = iVar7;
  ppuVar14 = &FileIoError::typeinfo;
LAB_0010aaa3:
  puStack_70 = &LAB_0010aab2;
  __cxa_throw(puVar13,ppuVar14,std::exception::~exception);
}

Assistant:

void
Flasher::write(const char* filename, uint32_t foffset)
{
    FILE* infile;
    uint32_t pageSize = _flash->pageSize();
    uint32_t pageNum = 0;
    uint32_t numPages;
    long fsize;
    size_t fbytes;

    if (foffset % pageSize != 0 || foffset >= _flash->totalSize())
        throw FlashOffsetError();
    
    infile = fopen(filename, "rb");
    if (!infile)
        throw FileOpenError(errno);

    try
    {
        if (fseek(infile, 0, SEEK_END) != 0 || (fsize = ftell(infile)) < 0)
            throw FileIoError(errno);
        
        rewind(infile);

        numPages = (fsize + pageSize - 1) / pageSize;
        if (numPages > _flash->numPages())
            throw FileSizeError();

        _observer.onStatus("Write %ld bytes to flash (%u pages)\n", fsize, numPages);
       
      
        if (_samba.canWriteBuffer())
        {
           
            uint32_t offset = 0;
            uint32_t bufferSize = _samba.writeBufferSize();
            uint8_t buffer[bufferSize];
            
            while ((fbytes = fread(buffer, 1, bufferSize, infile)) > 0)
            {
                _observer.onProgress(offset / pageSize, numPages);
                
                if (fbytes < bufferSize)
                {
                    memset(buffer + fbytes, 0, bufferSize - fbytes);
                    fbytes = (fbytes + pageSize - 1) / pageSize * pageSize;
                }
                
                _flash->loadBuffer(buffer, fbytes);
                _flash->writeBuffer(foffset + offset, fbytes);
                offset += fbytes;                
            }

        }
        else
        {
            uint8_t buffer[pageSize];
            uint32_t pageOffset = foffset / pageSize;

            while ((fbytes = fread(buffer, 1, pageSize, infile)) > 0)
            {
                _observer.onProgress(pageNum, numPages);

                _flash->loadBuffer(buffer, fbytes);
                _flash->writePage(pageOffset + pageNum);

                pageNum++;
                if (pageNum == numPages || fbytes != pageSize)
                    break;
            }

        }
    }
    catch(...)
    {
        fclose(infile);
        throw;
    }
    
    fclose(infile);
    _observer.onProgress(numPages, numPages);
}